

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O1

void ut::
     are_equal<agge::tests::(anonymous_namespace)::span,7ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
               (span (*expected) [7],
               vector<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
               *actual,LocationInfo *location)

{
  int *piVar1;
  int *piVar2;
  pointer psVar3;
  FailedAssertion *pFVar4;
  long lVar5;
  string local_40;
  
  psVar3 = (actual->
           super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(actual->
            super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 != 0x70) {
    pFVar4 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Values are not equal!","");
    FailedAssertion::FailedAssertion(pFVar4,&local_40,location);
    __cxa_throw(pFVar4,&FailedAssertion::typeinfo,FailedAssertion::~FailedAssertion);
  }
  if ((*expected)[0].y == psVar3->y) {
    lVar5 = 0x10;
    do {
      if (((*(int *)((long)&expected[-1][6].x + lVar5) != *(int *)((long)psVar3 + lVar5 + -0xc)) ||
          (*(int *)((long)&expected[-1][6].length + lVar5) != *(int *)((long)psVar3 + lVar5 + -8)))
         || (*(int *)((long)&expected[-1][6].cover + lVar5) != *(int *)((long)psVar3 + lVar5 + -4)))
      break;
      if (lVar5 == 0x70) {
        return;
      }
      piVar1 = (int *)((long)&(*expected)[0].y + lVar5);
      piVar2 = (int *)((long)&psVar3->y + lVar5);
      lVar5 = lVar5 + 0x10;
    } while (*piVar1 == *piVar2);
  }
  pFVar4 = (FailedAssertion *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Value is not \'true\'!","");
  FailedAssertion::FailedAssertion(pFVar4,&local_40,location);
  __cxa_throw(pFVar4,&FailedAssertion::typeinfo,FailedAssertion::~FailedAssertion);
}

Assistant:

inline void are_equal(T (&expected)[n], const ContainerT &actual, const LocationInfo &location)
	{
		are_equal(n, static_cast<size_t>(std::distance(actual.begin(), actual.end())), location);
		is_true(std::equal(expected, expected + n, actual.begin()), location);
	}